

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

VectorizedFunc<vkt::shaderexecutor::Functions::Pow,_4> *
vkt::shaderexecutor::
instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,4>>(void)

{
  int iVar1;
  
  if (instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,4>>()::
      s_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,4>>()
                                 ::s_instance);
    if (iVar1 != 0) {
      VectorizedFunc<vkt::shaderexecutor::Functions::Pow,_4>::VectorizedFunc
                (&instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,_4>_>
                  ::s_instance);
      __cxa_guard_release(&instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,4>>()
                           ::s_instance);
    }
  }
  return &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Pow,_4>_>::
          s_instance;
}

Assistant:

const T& instance (void)
{
	static const T s_instance = T();
	return s_instance;
}